

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license-generator.cpp
# Opt level: O2

string * license::LicenseGenerator::normalize_date(string *__return_storage_ptr__,string *sDate)

{
  string *psVar1;
  int iVar2;
  ostream *poVar3;
  invalid_argument *this;
  long lVar4;
  uint day;
  uint month;
  uint year;
  string *local_1b0;
  ostringstream oss;
  
  local_1b0 = __return_storage_ptr__;
  if (sDate->_M_string_length < 8) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Date string too small for known formats");
  }
  else {
    lVar4 = 0;
    while (lVar4 + 0x20 != 0x80) {
      iVar2 = __isoc99_sscanf((sDate->_M_dataplus)._M_p,
                              *(undefined8 *)((long)&formats_abi_cxx11_ + lVar4),&year,&month,&day);
      lVar4 = lVar4 + 0x20;
      if (iVar2 == 3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&oss);
        psVar1 = local_1b0;
        poVar3 = std::operator<<(poVar3,"-");
        poVar3 = std::operator<<(poVar3,0x30);
        *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,"-");
        poVar3 = std::operator<<(poVar3,0x30);
        *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
        std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
        return psVar1;
      }
    }
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Date string did not match a known format");
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

string LicenseGenerator::normalize_date(const std::string& sDate) {
	if(sDate.size()<8)
		throw invalid_argument("Date string too small for known formats");
	unsigned int year, month, day;
	bool found = false;
	for (size_t i = 0; i < formats_n && !found; ++i) {
		const int chread = sscanf(sDate.c_str(),formats[i].c_str(),&year,&month,&day);
		if(chread==3) {
			found = true;
			break;
		}
	}
	if(!found)
		throw invalid_argument("Date string did not match a known format");
	ostringstream oss;
	oss << year << "-" << setfill('0') << std::setw(2) << month << "-" << setfill('0') << std::setw(2) << day;
	return oss.str();
}